

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

void helper_pack(CPUS390XState_conflict *env,uint32_t len,uint64_t dest,uint64_t src)

{
  int iVar1;
  target_ulong tVar2;
  uint32_t uVar3;
  int iVar4;
  byte bVar5;
  target_ulong ptr;
  int iVar6;
  uint uVar7;
  uintptr_t unaff_retaddr;
  target_ulong local_48;
  
  uVar7 = len >> 4;
  local_48 = src + (len & 0xf);
  uVar3 = cpu_ldub_data_ra_s390x(env,local_48,unaff_retaddr);
  cpu_stb_data_ra_s390x(env,uVar7 + dest,(uVar3 & 0xff) >> 4 | (uVar3 & 0xff) << 4,unaff_retaddr);
  if (0xf < len) {
    iVar6 = (len & 0xf) - 1;
    local_48 = local_48 - 1;
    iVar4 = uVar7 + 1;
    ptr = dest + uVar7;
    do {
      ptr = ptr - 1;
      iVar1 = -1;
      if (iVar6 < 0) {
        bVar5 = 0;
        tVar2 = local_48;
      }
      else {
        uVar3 = cpu_ldub_data_ra_s390x(env,local_48,unaff_retaddr);
        bVar5 = (byte)uVar3 & 0xf;
        tVar2 = local_48 - 1;
        if (iVar6 != 0) {
          uVar3 = cpu_ldub_data_ra_s390x(env,local_48 - 1,unaff_retaddr);
          bVar5 = (char)uVar3 << 4 | bVar5;
          iVar1 = iVar6 + -2;
          tVar2 = local_48 - 2;
        }
      }
      local_48 = tVar2;
      iVar6 = iVar1;
      cpu_stb_data_ra_s390x(env,ptr,(uint)bVar5,unaff_retaddr);
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  return;
}

Assistant:

void HELPER(pack)(CPUS390XState *env, uint32_t len, uint64_t dest, uint64_t src)
{
    uintptr_t ra = GETPC();
    int len_dest = len >> 4;
    int len_src = len & 0xf;
    uint8_t b;

    dest += len_dest;
    src += len_src;

    /* last byte is special, it only flips the nibbles */
    b = cpu_ldub_data_ra(env, src, ra);
    cpu_stb_data_ra(env, dest, (b << 4) | (b >> 4), ra);
    src--;
    len_src--;

    /* now pack every value */
    while (len_dest > 0) {
        b = 0;

        if (len_src >= 0) {
            b = cpu_ldub_data_ra(env, src, ra) & 0x0f;
            src--;
            len_src--;
        }
        if (len_src >= 0) {
            b |= cpu_ldub_data_ra(env, src, ra) << 4;
            src--;
            len_src--;
        }

        len_dest--;
        dest--;
        cpu_stb_data_ra(env, dest, b, ra);
    }
}